

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O0

Matrix * __thiscall
LinearSystem::GetSolutionMatrix(Matrix *__return_storage_ptr__,LinearSystem *this)

{
  Permutation *this_00;
  Matrix *rhs;
  Permutation local_30;
  LinearSystem *local_18;
  LinearSystem *this_local;
  
  local_18 = this;
  this_local = (LinearSystem *)__return_storage_ptr__;
  this_00 = ExtendedMatrix::GetMainColumnPermutation(&this->system_);
  Permutation::GetInverse(&local_30,this_00);
  rhs = ExtendedMatrix::GetExtensionMatrix(&this->system_);
  operator*(__return_storage_ptr__,&local_30,rhs);
  Permutation::~Permutation(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Matrix LinearSystem::GetSolutionMatrix() const {
  return system_.GetMainColumnPermutation().GetInverse() * system_.GetExtensionMatrix();
}